

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_pathway.c
# Opt level: O2

void CGTFS_RecordPathway(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined **ppuVar5;
  char **ppcVar6;
  byte bVar7;
  char *field_names [12];
  pathway_t a;
  char *field_values [12];
  pathway_t local_1520;
  pathway_t m;
  pathway_t l;
  pathway_t k;
  pathway_t j;
  pathway_t i;
  pathway_t h;
  pathway_t g;
  pathway_t f;
  pathway_t e;
  pathway_t d;
  
  bVar7 = 0;
  iVar1 = greatest_test_pre("pathway_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      lVar4 = 0xc;
      ppuVar5 = &PTR_anon_var_dwarf_27cd_00221f60;
      ppcVar6 = field_names;
      for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppcVar6 = *ppuVar5;
        ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
        ppcVar6 = ppcVar6 + (ulong)bVar7 * -2 + 1;
      }
      ppuVar5 = &PTR_anon_var_dwarf_2851_00221fc0;
      ppcVar6 = field_values;
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        *ppcVar6 = *ppuVar5;
        ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
        ppcVar6 = ppcVar6 + (ulong)bVar7 * -2 + 1;
      }
      read_pathway(&a,0xc,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("INDEX456_abc",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x16;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00121104:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"INDEX456_abc\" != pw_1.id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("STOP_ID1",a.from_stop_id,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x17;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121104;
          greatest_info.msg = "\"STOP_ID1\" != pw_1.from_stop_id";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t
                            ("STOP_ID2",a.to_stop_id,&greatest_type_info_string,(void *)0x0);
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x18;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121104;
            greatest_info.msg = "\"STOP_ID2\" != pw_1.to_stop_id";
          }
          else if (a.mode == PTMD_MOVING) {
            if (a.is_bidirectional == PD_BIDIRECTIONAL) {
              if ((a.length != 123.4) || (NAN(a.length))) {
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "123.4 != pw_1.length";
                greatest_info.assertions = greatest_info.assertions + 3;
              }
              else if (a.traversal_time == 0xe10) {
                if (a.stair_count == 0xc) {
                  if ((a.max_slope != -1.008) || (NAN(a.max_slope))) {
                    greatest_info.fail_line = 0x1e;
                    greatest_info.msg = "-1.008 != pw_1.max_slope";
                    greatest_info.assertions = greatest_info.assertions + 6;
                  }
                  else if ((a.min_width != 2.3) || (NAN(a.min_width))) {
                    greatest_info.fail_line = 0x1f;
                    greatest_info.msg = "2.3 != pw_1.min_width";
                    greatest_info.assertions = greatest_info.assertions + 7;
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 8;
                    iVar2 = greatest_do_assert_equal_t
                                      ("Something A",a.signposted_as,&greatest_type_info_string,
                                       (void *)0x0);
                    if (iVar2 == 0) {
                      greatest_info.fail_line = 0x20;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_00121104;
                      greatest_info.msg = "\"Something A\" != pw_1.signposted_as";
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar2 = greatest_do_assert_equal_t
                                        ("Something B",a.reversed_signposted_as,
                                         &greatest_type_info_string,(void *)0x0);
                      if (iVar2 != 0) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_00121121;
                      }
                      greatest_info.fail_line = 0x21;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_00121104;
                      greatest_info.msg = "\"Something B\" != pw_1.reversed_signposted_as";
                    }
                  }
                }
                else {
                  greatest_info.fail_line = 0x1d;
                  greatest_info.msg = "12 != pw_1.stair_count";
                  greatest_info.assertions = greatest_info.assertions + 5;
                }
              }
              else {
                greatest_info.fail_line = 0x1c;
                greatest_info.msg = "3600 != pw_1.traversal_time";
                greatest_info.assertions = greatest_info.assertions + 4;
              }
            }
            else {
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "PD_BIDIRECTIONAL != pw_1.is_bidirectional";
              greatest_info.assertions = greatest_info.assertions + 2;
            }
          }
          else {
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "PTMD_MOVING != pw_1.mode";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00121620;
    }
LAB_00121121:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pathway_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"INDEX456_abc",0x1e8);
    memcpy(field_names,"INDEX456_abc",0x1e8);
    memcpy(field_values,"INDEX457_abc",0x1e8);
    memcpy(&d,"INDEX456_abc",0x1e8);
    memcpy(&e,"INDEX456_abc",0x1e8);
    memcpy(&f,"INDEX456_abc",0x1e8);
    memcpy(&g,"INDEX456_abc",0x1e8);
    memcpy(&h,"INDEX456_abc",0x1e8);
    memcpy(&i,"INDEX456_abc",0x1e8);
    memcpy(&j,"INDEX456_abc",0x1e8);
    memcpy(&k,"INDEX456_abc",0x1e8);
    memcpy(&l,"INDEX456_abc",0x1e8);
    memcpy(&m,"INDEX456_abc",0x1e8);
    memcpy(&local_1520,"INDEX456_abc",0x1e8);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_pathway(&a,(pathway_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_pathway(&a,(pathway_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_pathway((pathway_t *)field_names,(pathway_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_pathway((pathway_t *)field_names,&d);
          if (iVar1 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_pathway((pathway_t *)field_names,&e);
            if (iVar1 == 0) {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_pathway((pathway_t *)field_names,&f);
              if (iVar1 == 0) {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = equal_pathway((pathway_t *)field_names,&g);
                if (iVar1 == 0) {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar1 = equal_pathway((pathway_t *)field_names,&h);
                  if (iVar1 == 0) {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar1 = equal_pathway((pathway_t *)field_names,&i);
                    if (iVar1 == 0) {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar1 = equal_pathway((pathway_t *)field_names,&j);
                      if (iVar1 == 0) {
                        greatest_info.assertions = greatest_info.assertions + 1;
                        iVar1 = equal_pathway((pathway_t *)field_names,&k);
                        if (iVar1 == 0) {
                          greatest_info.assertions = greatest_info.assertions + 1;
                          iVar1 = equal_pathway((pathway_t *)field_names,&l);
                          if (iVar1 == 0) {
                            greatest_info.assertions = greatest_info.assertions + 1;
                            iVar1 = equal_pathway((pathway_t *)field_names,&m);
                            if (iVar1 == 0) {
                              greatest_info.assertions = greatest_info.assertions + 1;
                              iVar1 = equal_pathway((pathway_t *)field_names,&local_1520);
                              if (iVar1 == 0) {
                                greatest_info.msg = (char *)0x0;
                                iVar1 = 0;
                                goto LAB_00121326;
                              }
                              greatest_info.fail_line = 0x106;
                              greatest_info.msg = "0 != equal_pathway(&b, &n)";
                            }
                            else {
                              greatest_info.fail_line = 0x105;
                              greatest_info.msg = "0 != equal_pathway(&b, &m)";
                            }
                          }
                          else {
                            greatest_info.fail_line = 0x104;
                            greatest_info.msg = "0 != equal_pathway(&b, &l)";
                          }
                        }
                        else {
                          greatest_info.fail_line = 0x103;
                          greatest_info.msg = "0 != equal_pathway(&b, &k)";
                        }
                      }
                      else {
                        greatest_info.fail_line = 0x102;
                        greatest_info.msg = "0 != equal_pathway(&b, &j)";
                      }
                    }
                    else {
                      greatest_info.fail_line = 0x101;
                      greatest_info.msg = "0 != equal_pathway(&b, &i)";
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x100;
                    greatest_info.msg = "0 != equal_pathway(&b, &h)";
                  }
                }
                else {
                  greatest_info.fail_line = 0xff;
                  greatest_info.msg = "0 != equal_pathway(&b, &g)";
                }
              }
              else {
                greatest_info.fail_line = 0xfe;
                greatest_info.msg = "0 != equal_pathway(&b, &f)";
              }
            }
            else {
              greatest_info.fail_line = 0xfd;
              greatest_info.msg = "0 != equal_pathway(&b, &e)";
            }
          }
          else {
            greatest_info.fail_line = 0xfc;
            greatest_info.msg = "0 != equal_pathway(&b, &d)";
          }
        }
        else {
          greatest_info.fail_line = 0xfb;
          greatest_info.msg = "0 != equal_pathway(&b, &c)";
        }
      }
      else {
        greatest_info.fail_line = 0xfa;
        greatest_info.msg = "0 != equal_pathway(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0xf9;
      greatest_info.msg = "1 != equal_pathway(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00121620:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_00121326:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordPathway) {
    RUN_TEST(pathway_read);
    RUN_TEST(pathway_compare);
}